

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall
cmComputeLinkDepends::QueueSharedDependencies
          (cmComputeLinkDepends *this,int depender_index,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *deps)

{
  pointer pcVar1;
  SharedDepEntry qe;
  value_type local_60;
  
  for (pcVar1 = (deps->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pcVar1 != (deps->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
                super__Vector_impl_data._M_finish; pcVar1 = pcVar1 + 1) {
    local_60.Item.super_string._M_string_length = 0;
    local_60.Item.super_string.field_2._M_local_buf[0] = '\0';
    local_60.Item.Target = (cmGeneratorTarget *)0x0;
    local_60.Item.super_string._M_dataplus._M_p = (pointer)&local_60.Item.super_string.field_2;
    cmLinkItem::operator=(&local_60.Item,pcVar1);
    local_60.DependerIndex = depender_index;
    std::
    deque<cmComputeLinkDepends::SharedDepEntry,_std::allocator<cmComputeLinkDepends::SharedDepEntry>_>
    ::push_back(&(this->SharedDepQueue).c,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::QueueSharedDependencies(
  int depender_index, std::vector<cmLinkItem> const& deps)
{
  for (std::vector<cmLinkItem>::const_iterator li = deps.begin();
       li != deps.end(); ++li) {
    SharedDepEntry qe;
    qe.Item = *li;
    qe.DependerIndex = depender_index;
    this->SharedDepQueue.push(qe);
  }
}